

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,IfStatement *statement)

{
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_00;
  Statement *pSVar1;
  _Elt_pointer piVar2;
  int iVar3;
  SubtreeWrapper *pSVar4;
  SubtreeWrapper *pSVar5;
  SubtreeWrapper *pSVar6;
  _Elt_pointer piVar7;
  LabelStatement *pLVar8;
  LabelStatement *pLVar9;
  SeqStatement *pSVar10;
  undefined4 extraout_var;
  JumpStatement *pJVar11;
  LabelStatement *this_01;
  undefined4 extraout_var_00;
  SeqStatement *this_02;
  undefined4 extraout_var_01;
  StatementWrapper *pSVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  string *psVar13;
  LabelStatement *local_228;
  string *local_210;
  Label label_true;
  Label label_false;
  Label label_join;
  string local_190 [32];
  string local_170 [32];
  Label local_150;
  Label local_130;
  Label local_110;
  Label local_f0;
  string local_d0 [32];
  string local_b0 [32];
  Label local_90;
  Label local_70;
  Label local_50;
  
  pSVar1 = statement->else_statement_;
  pSVar4 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->expression_->super_Node);
  this_00 = &this->offsets_;
  piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  piVar2 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first;
  if (pSVar1 == (Statement *)0x0) {
    if (piVar7 == piVar2) {
      piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    this->current_layer_ =
         (this->current_layer_->children_).
         super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
         super__Vector_impl_data._M_start[piVar7[-1]];
    label_true.label_._M_dataplus._M_p._0_4_ = 0;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&label_true);
    IRT::FrameTranslator::SetupScope(this->current_frame_);
    pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &statement->if_statement_->super_Node);
    std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
    piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar7 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    iVar3 = piVar7[-1];
    std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
    label_true.label_._M_dataplus._M_p._0_4_ = iVar3 + 1;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&label_true);
    this->current_layer_ = this->current_layer_->parent_;
    IRT::FrameTranslator::TearDownScope(this->current_frame_);
    IRT::Label::Label(&label_true);
    IRT::Label::Label(&label_false);
    pLVar8 = (LabelStatement *)operator_new(0x28);
    psVar13 = (string *)&label_false;
    std::__cxx11::string::string((string *)&local_50,psVar13);
    IRT::LabelStatement::LabelStatement(pLVar8,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pSVar5 != (SubtreeWrapper *)0x0) {
      pLVar9 = (LabelStatement *)operator_new(0x18);
      this_01 = (LabelStatement *)operator_new(0x28);
      psVar13 = (string *)&label_true;
      std::__cxx11::string::string((string *)&local_70,psVar13);
      IRT::LabelStatement::LabelStatement(this_01,&local_70);
      pSVar10 = (SeqStatement *)operator_new(0x18);
      iVar3 = (*pSVar5->_vptr_SubtreeWrapper[3])(pSVar5);
      this_02 = (SeqStatement *)operator_new(0x18);
      pJVar11 = (JumpStatement *)operator_new(0x28);
      std::__cxx11::string::string((string *)&local_90,(string *)&label_false);
      IRT::JumpStatement::JumpStatement(pJVar11,&local_90);
      IRT::SeqStatement::SeqStatement(this_02,(Statement *)pJVar11,(Statement *)pLVar8);
      IRT::SeqStatement::SeqStatement
                (pSVar10,(Statement *)CONCAT44(extraout_var_00,iVar3),(Statement *)this_02);
      IRT::SeqStatement::SeqStatement
                ((SeqStatement *)pLVar9,(Statement *)this_01,(Statement *)pSVar10);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      pLVar8 = pLVar9;
    }
    pSVar12 = (StatementWrapper *)operator_new(0x10);
    pSVar10 = (SeqStatement *)operator_new(0x18);
    std::__cxx11::string::string(local_b0,psVar13);
    std::__cxx11::string::string(local_d0,(string *)&label_false);
    iVar3 = (*pSVar4->_vptr_SubtreeWrapper[4])(pSVar4,local_b0,local_d0);
    IRT::SeqStatement::SeqStatement
              (pSVar10,(Statement *)CONCAT44(extraout_var_03,iVar3),&pLVar8->super_Statement);
    IRT::StatementWrapper::StatementWrapper(pSVar12,(Statement *)pSVar10);
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pSVar12;
    std::__cxx11::string::~string(local_d0);
    psVar13 = local_b0;
    goto LAB_0011c760;
  }
  if (piVar7 == piVar2) {
    piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  this->current_layer_ =
       (this->current_layer_->children_).
       super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
       super__Vector_impl_data._M_start[piVar7[-1]];
  label_true.label_._M_dataplus._M_p._0_4_ = 0;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&label_true);
  IRT::FrameTranslator::SetupScope(this->current_frame_);
  pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->if_statement_->super_Node);
  std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
  piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar7 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  iVar3 = piVar7[-1];
  std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
  label_true.label_._M_dataplus._M_p._0_4_ = iVar3 + 1;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&label_true);
  this->current_layer_ = this->current_layer_->parent_;
  IRT::FrameTranslator::TearDownScope(this->current_frame_);
  piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar7 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  this->current_layer_ =
       (this->current_layer_->children_).
       super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
       super__Vector_impl_data._M_start[piVar7[-1]];
  label_true.label_._M_dataplus._M_p._0_4_ = 0;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&label_true);
  IRT::FrameTranslator::SetupScope(this->current_frame_);
  pSVar6 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->else_statement_->super_Node);
  std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
  piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar7 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar7 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  iVar3 = piVar7[-1];
  std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
  label_true.label_._M_dataplus._M_p._0_4_ = iVar3 + 1;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&label_true);
  this->current_layer_ = this->current_layer_->parent_;
  IRT::FrameTranslator::TearDownScope(this->current_frame_);
  IRT::Label::Label(&label_true);
  IRT::Label::Label(&label_false);
  IRT::Label::Label(&label_join);
  pLVar8 = (LabelStatement *)operator_new(0x28);
  psVar13 = (string *)&label_join;
  std::__cxx11::string::string((string *)&local_f0,psVar13);
  IRT::LabelStatement::LabelStatement(pLVar8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (pSVar6 == (SubtreeWrapper *)0x0) {
    psVar13 = (string *)&label_join;
    local_228 = pLVar8;
    local_210 = psVar13;
    if (pSVar5 != (SubtreeWrapper *)0x0) goto LAB_0011c5a2;
  }
  else {
    local_228 = (LabelStatement *)operator_new(0x18);
    pLVar9 = (LabelStatement *)operator_new(0x28);
    local_210 = (string *)&label_false;
    std::__cxx11::string::string((string *)&local_110,local_210);
    IRT::LabelStatement::LabelStatement(pLVar9,&local_110);
    pSVar10 = (SeqStatement *)operator_new(0x18);
    iVar3 = (*pSVar6->_vptr_SubtreeWrapper[3])(pSVar6);
    IRT::SeqStatement::SeqStatement
              (pSVar10,(Statement *)CONCAT44(extraout_var,iVar3),(Statement *)pLVar8);
    IRT::SeqStatement::SeqStatement
              ((SeqStatement *)local_228,(Statement *)pLVar9,(Statement *)pSVar10);
    std::__cxx11::string::~string((string *)&local_110);
    if (pSVar5 != (SubtreeWrapper *)0x0) {
      pLVar8 = (LabelStatement *)operator_new(0x18);
      pJVar11 = (JumpStatement *)operator_new(0x28);
      std::__cxx11::string::string((string *)&local_130,(string *)&label_join);
      IRT::JumpStatement::JumpStatement(pJVar11,&local_130);
      IRT::SeqStatement::SeqStatement
                ((SeqStatement *)pLVar8,(Statement *)pJVar11,(Statement *)local_228);
      std::__cxx11::string::~string((string *)&local_130);
      local_210 = (string *)&label_false;
LAB_0011c5a2:
      local_228 = (LabelStatement *)operator_new(0x18);
      pLVar9 = (LabelStatement *)operator_new(0x28);
      psVar13 = (string *)&label_true;
      std::__cxx11::string::string((string *)&local_150,psVar13);
      IRT::LabelStatement::LabelStatement(pLVar9,&local_150);
      pSVar10 = (SeqStatement *)operator_new(0x18);
      iVar3 = (*pSVar5->_vptr_SubtreeWrapper[3])(pSVar5);
      IRT::SeqStatement::SeqStatement
                (pSVar10,(Statement *)CONCAT44(extraout_var_01,iVar3),&pLVar8->super_Statement);
      IRT::SeqStatement::SeqStatement
                ((SeqStatement *)local_228,(Statement *)pLVar9,(Statement *)pSVar10);
      std::__cxx11::string::~string((string *)&local_150);
    }
  }
  pSVar12 = (StatementWrapper *)operator_new(0x10);
  pSVar10 = (SeqStatement *)operator_new(0x18);
  std::__cxx11::string::string(local_170,psVar13);
  std::__cxx11::string::string(local_190,local_210);
  iVar3 = (*pSVar4->_vptr_SubtreeWrapper[4])(pSVar4,local_170,local_190);
  IRT::SeqStatement::SeqStatement
            (pSVar10,(Statement *)CONCAT44(extraout_var_02,iVar3),&local_228->super_Statement);
  IRT::StatementWrapper::StatementWrapper(pSVar12,(Statement *)pSVar10);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pSVar12;
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_170);
  psVar13 = (string *)&label_join;
LAB_0011c760:
  std::__cxx11::string::~string(psVar13);
  std::__cxx11::string::~string((string *)&label_false);
  std::__cxx11::string::~string((string *)&label_true);
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(IfStatement* statement) {
  if (statement->else_statement_ == nullptr) {
    auto if_expression = Accept(statement->expression_);

    current_layer_ = current_layer_->children_[offsets_.top()];
    offsets_.push(0);
    current_frame_->SetupScope();
    auto true_stmt = Accept(statement->if_statement_);
    offsets_.pop();
    size_t index = offsets_.top();
    offsets_.pop();
    offsets_.push(index + 1);
    current_layer_ = current_layer_->parent_;
    current_frame_->TearDownScope();

    IRT::Label label_true;
    IRT::Label label_join;

    IRT::Statement* suffix = new IRT::LabelStatement(label_join);

    IRT::Label* result_true = &label_join;
    IRT::Label* result_false = &label_join;

    if (true_stmt) {
      result_true = &label_true;
      suffix = new IRT::SeqStatement(
          new IRT::LabelStatement(label_true),
          new IRT::SeqStatement(
              true_stmt->ToStatement(),
              new IRT::SeqStatement(new IRT::JumpStatement(label_join),
                                    suffix)));
    }

    tos_value_ = new IRT::StatementWrapper(new IRT::SeqStatement(
        if_expression->ToConditional(*result_true, *result_false), suffix));
  } else {
    auto if_expression = Accept(statement->expression_);

    current_layer_ = current_layer_->children_[offsets_.top()];
    offsets_.push(0);
    current_frame_->SetupScope();
    auto true_stmt = Accept(statement->if_statement_);
    offsets_.pop();
    size_t index = offsets_.top();
    offsets_.pop();
    offsets_.push(index + 1);
    current_layer_ = current_layer_->parent_;
    current_frame_->TearDownScope();

    current_layer_ = current_layer_->children_[offsets_.top()];
    offsets_.push(0);
    current_frame_->SetupScope();
    auto false_stmt = Accept(statement->else_statement_);
    offsets_.pop();
    index = offsets_.top();
    offsets_.pop();
    offsets_.push(index + 1);
    current_layer_ = current_layer_->parent_;
    current_frame_->TearDownScope();

    IRT::Label label_true;
    IRT::Label label_false;
    IRT::Label label_join;

    IRT::Statement* suffix = new IRT::LabelStatement(label_join);

    IRT::Label* result_true = &label_join;
    IRT::Label* result_false = &label_join;

    if (false_stmt) {
      result_false = &label_false;
      suffix = new IRT::SeqStatement(
          new IRT::LabelStatement(label_false),
          new IRT::SeqStatement(false_stmt->ToStatement(), suffix));

      if (true_stmt) {
        suffix =
            new IRT::SeqStatement(new IRT::JumpStatement(label_join), suffix);
      }
    }

    if (true_stmt) {
      result_true = &label_true;
      suffix = new IRT::SeqStatement(
          new IRT::LabelStatement(label_true),
          new IRT::SeqStatement(true_stmt->ToStatement(), suffix));
    }

    tos_value_ = new IRT::StatementWrapper(new IRT::SeqStatement(
        if_expression->ToConditional(*result_true, *result_false), suffix));
  }
}